

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr c4::yml::normalize_tag_long(csubstr tag)

{
  code *pcVar1;
  bool bVar2;
  YamlTag_e tag_00;
  size_t in_RDX;
  ro_substr pattern;
  ro_substr pattern_00;
  csubstr cVar3;
  csubstr cVar4;
  basic_substring<const_char> local_28;
  basic_substring<const_char> local_18;
  
  cVar4.str = (char *)tag.len;
  local_28.str = tag.str;
  cVar4.len = in_RDX;
  local_28.len = (size_t)cVar4.str;
  tag_00 = to_tag((yml *)local_28.str,cVar4);
  if (tag_00 == TAG_NONE) {
    pattern.len = 2;
    pattern.str = "!<";
    bVar2 = basic_substring<const_char>::begins_with(&local_28,pattern);
    if (bVar2) {
      if ((char *)local_28.len == (char *)0x0) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar2 = is_debugger_attached();
          if (bVar2) {
            pcVar1 = (code *)swi(3);
            cVar4 = (csubstr)(*pcVar1)();
            return cVar4;
          }
        }
        handle_error(0x20a4ad,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (&local_18,(char *)(local_28.str + 1),(size_t)(local_28.len + -1));
      local_28.str = local_18.str;
      local_28.len = local_18.len;
    }
    pattern_00.len = 2;
    pattern_00.str = "<!";
    basic_substring<const_char>::begins_with(&local_28,pattern_00);
    cVar3.len = local_28.len;
    cVar3.str = local_28.str;
  }
  else {
    cVar3 = from_tag_long(tag_00);
  }
  return cVar3;
}

Assistant:

csubstr normalize_tag_long(csubstr tag)
{
    YamlTag_e t = to_tag(tag);
    if(t != TAG_NONE)
        return from_tag_long(t);
    if(tag.begins_with("!<"))
        tag = tag.sub(1);
    if(tag.begins_with("<!"))
        return tag;
    return tag;
}